

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint32_t helper_efsctui(CPUPPCState_conflict *env,uint32_t val)

{
  int iVar1;
  uint32_t uVar2;
  
  iVar1 = float32_is_quiet_nan_ppc(val,&env->vec_status);
  if (iVar1 == 0) {
    uVar2 = float32_to_uint32_ppc(val,&env->vec_status);
    return uVar2;
  }
  return 0;
}

Assistant:

static inline uint32_t efsctui(CPUPPCState *env, uint32_t val)
{
    CPU_FloatU u;

    u.l = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float32_is_quiet_nan(u.f, &env->vec_status))) {
        return 0;
    }

    return float32_to_uint32(u.f, &env->vec_status);
}